

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vehicle.cpp
# Opt level: O3

void __thiscall Vehicle::add_node(Vehicle *this,Point *p,int pos,int *ec)

{
  size_t *psVar1;
  _Node *p_Var2;
  mapped_type *pmVar3;
  int iVar4;
  shared_ptr<VehicleState> possible_state;
  shared_ptr<VehicleState> local_40;
  shared_ptr<VehicleState> local_30;
  
  local_40.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  (local_40.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_40.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_40.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00120d30;
  local_40.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_40.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1)
  ;
  local_40.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)p;
  local_40.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 1000;
  local_40.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_40.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_use_count = 0;
  local_40.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_weak_count = 0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_40.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = (local_40.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_40.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = 2;
  }
  local_30.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_40.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_40.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  validate_states(this,&local_40,pos,ec);
  if (local_40.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (*ec == 0) {
    iVar4 = pos + 1;
    do {
      iVar4 = iVar4 + -1;
    } while (0 < iVar4);
    p_Var2 = std::__cxx11::
             list<std::shared_ptr<VehicleState>,std::allocator<std::shared_ptr<VehicleState>>>::
             _M_create_node<std::shared_ptr<VehicleState>const&>
                       ((list<std::shared_ptr<VehicleState>,std::allocator<std::shared_ptr<VehicleState>>>
                         *)&this->nodes,&local_30);
    std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
    psVar1 = &(this->nodes).
              super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    pmVar3 = std::__detail::
             _Map_base<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&p->state,&this->solution);
    pmVar3->first = this;
  }
  if (local_30.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void Vehicle::add_node(Point *p, int pos, int &ec) {

    auto possible_state = std::make_shared<VehicleState>(p);
    validate_states(possible_state, pos, ec);
    if (ec)
        return;

    auto it = nodes.begin();
    auto tmp_pos = pos;
    while (tmp_pos-- > 0)
        ++it;

    nodes.insert(it, possible_state);
    p->state[solution].first = this;
}